

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  bool bVar1;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_7a;
  undefined1 local_79;
  Type local_78;
  Type local_58;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  CSharpGenerator *this_local;
  string *getter;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__p.__string",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_58,type);
    GenGetter_abi_cxx11_(__return_storage_ptr__,this,&local_58);
    break;
  case BASE_TYPE_STRUCT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__p.__struct",local_35);
    std::allocator<char>::~allocator(local_35);
    break;
  case BASE_TYPE_UNION:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__p.__union",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case BASE_TYPE_ARRAY:
    Type::VectorType(&local_78,type);
    GenGetter_abi_cxx11_(__return_storage_ptr__,this,&local_78);
    break;
  default:
    local_79 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__p.bb.Get",&local_7a);
    std::allocator<char>::~allocator(&local_7a);
    if (local_20->base_type == BASE_TYPE_BOOL) {
      std::operator+(&local_a0,"0!=",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      GenTypeBasic_abi_cxx11_(&local_c0,this,local_20,false);
      bVar1 = std::operator!=(&local_c0,"byte");
      std::__cxx11::string::~string((string *)&local_c0);
      if (bVar1) {
        GenTypeBasic_abi_cxx11_(&local_100,this,local_20,false);
        ConvertCase(&local_e0,&local_100,kUpperCamel,kSnake);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__p.__string";
      case BASE_TYPE_STRUCT: return "__p.__struct";
      case BASE_TYPE_UNION: return "__p.__union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      case BASE_TYPE_ARRAY: return GenGetter(type.VectorType());
      default: {
        std::string getter = "__p.bb.Get";
        if (type.base_type == BASE_TYPE_BOOL) {
          getter = "0!=" + getter;
        } else if (GenTypeBasic(type, false) != "byte") {
          getter += ConvertCase(GenTypeBasic(type, false), Case::kUpperCamel);
        }
        return getter;
      }
    }
  }